

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_std::chrono::time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_&,_const_hta::Clock::time_point_&>
::streamReconstructedExpression
          (BinaryExpr<const_std::chrono::time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_&,_const_hta::Clock::time_point_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *in_RDX;
  string *in_R9;
  StringRef op;
  string asStack_58 [32];
  string local_38;
  
  StringMaker<std::chrono::time_point<hta::Clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,void>
  ::convert_abi_cxx11_
            (&local_38,
             (StringMaker<std::chrono::time_point<hta::Clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,void>
              *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  std::__cxx11::string::string(asStack_58,(string *)Detail::unprintableString_abi_cxx11_);
  op.m_size = (size_type)asStack_58;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_38,lhs,op,in_R9);
  std::__cxx11::string::~string(asStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }